

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Options * leveldb::SanitizeOptions
                    (Options *__return_storage_ptr__,string *dbname,InternalKeyComparator *icmp,
                    InternalFilterPolicy *ipolicy,Options *src)

{
  Env *pEVar1;
  bool bVar2;
  Cache *pCVar3;
  Options *local_b8;
  Options *result;
  Status local_80;
  Status s;
  string local_58;
  Status local_38;
  Status local_30;
  Options *local_28;
  Options *src_local;
  InternalFilterPolicy *ipolicy_local;
  InternalKeyComparator *icmp_local;
  string *dbname_local;
  
  local_28 = src;
  src_local = (Options *)ipolicy;
  ipolicy_local = (InternalFilterPolicy *)icmp;
  icmp_local = (InternalKeyComparator *)dbname;
  memcpy(__return_storage_ptr__,src,0x60);
  __return_storage_ptr__->comparator = (Comparator *)ipolicy_local;
  if (local_28->filter_policy == (FilterPolicy *)0x0) {
    local_b8 = (Options *)0x0;
  }
  else {
    local_b8 = src_local;
  }
  __return_storage_ptr__->filter_policy = (FilterPolicy *)local_b8;
  ClipToRange<int,int>(&__return_storage_ptr__->max_open_files,0x4a,50000);
  ClipToRange<unsigned_long,int>(&__return_storage_ptr__->write_buffer_size,0x10000,0x40000000);
  ClipToRange<unsigned_long,int>(&__return_storage_ptr__->max_file_size,0x100000,0x40000000);
  ClipToRange<unsigned_long,int>(&__return_storage_ptr__->block_size,0x400,0x400000);
  if (__return_storage_ptr__->info_log == (Logger *)0x0) {
    (*local_28->env->_vptr_Env[10])(&local_30,local_28->env,icmp_local);
    Status::~Status(&local_30);
    pEVar1 = local_28->env;
    InfoLogFileName(&local_58,(string *)icmp_local);
    OldInfoLogFileName((string *)&s,(string *)icmp_local);
    (*pEVar1->_vptr_Env[0xe])(&local_38,pEVar1,&local_58,&s);
    Status::~Status(&local_38);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::~string((string *)&local_58);
    pEVar1 = local_28->env;
    InfoLogFileName((string *)&result,(string *)icmp_local);
    (*pEVar1->_vptr_Env[0x14])(&local_80,pEVar1,&result,&__return_storage_ptr__->info_log);
    std::__cxx11::string::~string((string *)&result);
    bVar2 = Status::ok(&local_80);
    if (!bVar2) {
      __return_storage_ptr__->info_log = (Logger *)0x0;
    }
    Status::~Status(&local_80);
  }
  if (__return_storage_ptr__->block_cache == (Cache *)0x0) {
    pCVar3 = NewLRUCache(0x800000);
    __return_storage_ptr__->block_cache = pCVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

Options SanitizeOptions(const std::string& dbname,
                        const InternalKeyComparator* icmp,
                        const InternalFilterPolicy* ipolicy,
                        const Options& src) {
  Options result = src;
  result.comparator = icmp;
  result.filter_policy = (src.filter_policy != nullptr) ? ipolicy : nullptr;
  ClipToRange(&result.max_open_files, 64 + kNumNonTableCacheFiles, 50000);
  ClipToRange(&result.write_buffer_size, 64 << 10, 1 << 30);
  ClipToRange(&result.max_file_size, 1 << 20, 1 << 30);
  ClipToRange(&result.block_size, 1 << 10, 4 << 20);
  if (result.info_log == nullptr) {
    // Open a log file in the same directory as the db
    src.env->CreateDir(dbname);  // In case it does not exist
    src.env->RenameFile(InfoLogFileName(dbname), OldInfoLogFileName(dbname));
    Status s = src.env->NewLogger(InfoLogFileName(dbname), &result.info_log);
    if (!s.ok()) {
      // No place suitable for logging
      result.info_log = nullptr;
    }
  }
  if (result.block_cache == nullptr) {
    result.block_cache = NewLRUCache(8 << 20);
  }
  return result;
}